

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O1

int ast_parse_expression_with_parentheses(lgx_ast_t *ast,lgx_ast_node_t *parent)

{
  int iVar1;
  int iVar2;
  
  if (ast->cur_token == TK_LEFT_PAREN) {
    ast_step(ast);
    iVar1 = ast_parse_sub_expression(ast,parent,0xf);
    iVar2 = 1;
    if (iVar1 == 0) {
      if (ast->cur_token == TK_RIGHT_PAREN) {
        ast_step(ast);
        iVar2 = 0;
      }
      else {
        ast_error(ast,"\')\' expected before `%.*s`\n",(ulong)(uint)ast->cur_length,ast->cur_start);
      }
    }
  }
  else {
    ast_error(ast,"\'(\' expected before `%.*s`\n",(ulong)(uint)ast->cur_length,ast->cur_start);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int ast_parse_expression_with_parentheses(lgx_ast_t* ast, lgx_ast_node_t* parent) {
    if (ast->cur_token != TK_LEFT_PAREN) {
        ast_error(ast, "'(' expected before `%.*s`\n", ast->cur_length, ast->cur_start);
        return 1;
    }
    ast_step(ast);

    if (ast_parse_sub_expression(ast, parent, 15)) {
        return 1;
    }

    if (ast->cur_token != TK_RIGHT_PAREN) {
        ast_error(ast, "')' expected before `%.*s`\n", ast->cur_length, ast->cur_start);
        return 1;
    }
    ast_step(ast);

    return 0;
}